

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

int util::to_int(string *subject)

{
  int iVar1;
  variant vStack_48;
  
  variant::variant(&vStack_48,subject);
  iVar1 = variant::GetInt(&vStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vStack_48.val_string._M_dataplus._M_p != &vStack_48.val_string.field_2) {
    operator_delete(vStack_48.val_string._M_dataplus._M_p,
                    vStack_48.val_string.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int to_int(const std::string &subject)
{
	return static_cast<int>(util::variant(subject));
}